

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

void __thiscall ncnn::ParamDict::ParamDict(ParamDict *this,ParamDict *rhs)

{
  int iVar1;
  ParamDictPrivate *pPVar2;
  ParamDictPrivate *pPVar3;
  long lVar4;
  
  this->_vptr_ParamDict = (_func_int **)&PTR__ParamDict_00333510;
  pPVar3 = (ParamDictPrivate *)operator_new(0xa00);
  ParamDictPrivate::ParamDictPrivate(pPVar3);
  this->d = pPVar3;
  for (lVar4 = 8; lVar4 != 0xa08; lVar4 = lVar4 + 0x50) {
    pPVar3 = rhs->d;
    iVar1 = *(int *)((long)pPVar3->params + lVar4 + -8);
    pPVar2 = this->d;
    *(int *)((long)pPVar2->params + lVar4 + -8) = iVar1;
    if (iVar1 - 1U < 3) {
      *(undefined4 *)((long)pPVar2->params + lVar4 + -4) =
           *(undefined4 *)((long)pPVar3->params + lVar4 + -4);
    }
    else {
      Mat::operator=((Mat *)((long)&pPVar2->params[0].type + lVar4),
                     (Mat *)((long)&pPVar3->params[0].type + lVar4));
    }
  }
  return;
}

Assistant:

ParamDict::ParamDict(const ParamDict& rhs)
    : d(new ParamDictPrivate)
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        int type = rhs.d->params[i].type;
        d->params[i].type = type;
        if (type == 1 || type == 2 || type == 3)
        {
            d->params[i].i = rhs.d->params[i].i;
        }
        else // if (type == 4 || type == 5 || type == 6)
        {
            d->params[i].v = rhs.d->params[i].v;
        }
    }
}